

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.h
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
cpp_db::value_of<std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          cpp_db *this,value *val)

{
  int iVar1;
  type_info *this_00;
  char *__s1;
  char *__s2;
  type_mismatch *this_01;
  type_index local_38 [3];
  type_index local_20;
  any *local_18;
  value *val_local;
  
  local_18 = (any *)this;
  val_local = (value *)__return_storage_ptr__;
  this_00 = std::any::type((any *)this);
  __s1 = std::type_info::name(this_00);
  __s2 = std::type_info::name
                   ((type_info *)&std::vector<unsigned_char,std::allocator<unsigned_char>>::typeinfo
                   );
  iVar1 = strcmp(__s1,__s2);
  if (iVar1 == 0) {
    std::any_cast<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (__return_storage_ptr__,local_18);
    return __return_storage_ptr__;
  }
  this_01 = (type_mismatch *)__cxa_allocate_exception(0x10);
  local_20 = type_of(local_18);
  std::type_index::type_index
            (local_38,(type_info *)
                      &std::vector<unsigned_char,std::allocator<unsigned_char>>::typeinfo);
  type_mismatch::type_mismatch(this_01,&local_20,local_38);
  __cxa_throw(this_01,&type_mismatch::typeinfo,type_mismatch::~type_mismatch);
}

Assistant:

T value_of(const value &val)
    {
		if (!strcmp(val.type().name(), typeid(T).name()))
            return std::any_cast<T>(val);
        throw type_mismatch(type_of(val), typeid(T));
    }